

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  undefined4 uVar1;
  ZSTD_compressedBlockState_t *pZVar2;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  ZSTD_dictMode_e dictMode_00;
  uint uVar13;
  ZSTD_matchState_t *ms_00;
  size_t code;
  ZSTD_blockCompressor p_Var14;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff24;
  ZSTD_strategy in_stack_ffffffffffffff28;
  int iVar15;
  ZSTD_compressedBlockState_t *tmp;
  BYTE *lastLiterals;
  ZSTD_blockCompressor blockCompressor;
  size_t errcod;
  rawSeqStore_t ldmSeqStore;
  size_t sStack_88;
  int i;
  size_t lastLLSize;
  ZSTD_dictMode_e dictMode;
  U32 current;
  BYTE *istart;
  BYTE *base;
  size_t local_48;
  size_t cSize;
  ZSTD_matchState_t *ms;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *zc_local;
  
  ms_00 = &(zc->blockState).matchState;
  uVar3 = (zc->appliedParams).cParams.hashLog;
  uVar4 = (zc->appliedParams).cParams.searchLog;
  uVar5 = (zc->appliedParams).cParams.minMatch;
  uVar6 = (zc->appliedParams).cParams.targetLength;
  uVar7 = (zc->appliedParams).cParams.strategy;
  cParams1.minMatch = uVar7;
  cParams1.searchLog = uVar6;
  cParams1.hashLog = uVar5;
  cParams1.chainLog = uVar4;
  cParams1.windowLog = uVar3;
  uVar1 = (zc->blockState).matchState.cParams.windowLog;
  uVar8 = (zc->blockState).matchState.cParams.hashLog;
  uVar9 = (zc->blockState).matchState.cParams.searchLog;
  uVar10 = (zc->blockState).matchState.cParams.minMatch;
  uVar11 = (zc->blockState).matchState.cParams.targetLength;
  uVar12 = (zc->blockState).matchState.cParams.strategy;
  cParams2.minMatch = uVar12;
  cParams2.searchLog = uVar11;
  cParams2.hashLog = uVar10;
  cParams2.chainLog = uVar9;
  cParams2.windowLog = uVar8;
  cParams1.targetLength = in_stack_ffffffffffffff04;
  cParams1.strategy = uVar1;
  cParams2.targetLength = in_stack_ffffffffffffff24;
  cParams2.strategy = in_stack_ffffffffffffff28;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
    local_48 = 0;
  }
  else {
    ZSTD_resetSeqStore(&zc->seqStore);
    (zc->blockState).matchState.opt.symbolCosts = &((zc->blockState).prevCBlock)->entropy;
    uVar13 = (int)src - (int)(zc->blockState).matchState.window.base;
    if ((zc->blockState).matchState.nextToUpdate + 0x180 < uVar13) {
      if ((uVar13 - (zc->blockState).matchState.nextToUpdate) - 0x180 < 0xc1) {
        iVar15 = (uVar13 - (zc->blockState).matchState.nextToUpdate) + -0x180;
      }
      else {
        iVar15 = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar13 - iVar15;
    }
    dictMode_00 = ZSTD_matchState_dictMode(ms_00);
    for (ldmSeqStore.capacity._4_4_ = 0; ldmSeqStore.capacity._4_4_ < 3;
        ldmSeqStore.capacity._4_4_ = ldmSeqStore.capacity._4_4_ + 1) {
      ((zc->blockState).nextCBlock)->rep[ldmSeqStore.capacity._4_4_] =
           ((zc->blockState).prevCBlock)->rep[ldmSeqStore.capacity._4_4_];
    }
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      sStack_88 = ZSTD_ldm_blockCompress
                            (&zc->externSeqStore,ms_00,&zc->seqStore,
                             ((zc->blockState).nextCBlock)->rep,src,srcSize);
    }
    else if ((zc->appliedParams).ldmParams.enableLdm == 0) {
      p_Var14 = ZSTD_selectBlockCompressor((zc->appliedParams).cParams.strategy,dictMode_00);
      sStack_88 = (*p_Var14)(ms_00,&zc->seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
    }
    else {
      memset(&errcod,0,0x20);
      errcod = (size_t)zc->ldmSequences;
      ldmSeqStore.size = zc->maxNbLdmSequences;
      code = ZSTD_ldm_generateSequences
                       (&zc->ldmState,(rawSeqStore_t *)&errcod,&(zc->appliedParams).ldmParams,src,
                        srcSize);
      uVar13 = ERR_isError(code);
      if (uVar13 != 0) {
        return code;
      }
      sStack_88 = ZSTD_ldm_blockCompress
                            ((rawSeqStore_t *)&errcod,ms_00,&zc->seqStore,
                             ((zc->blockState).nextCBlock)->rep,src,srcSize);
    }
    ZSTD_storeLastLiterals(&zc->seqStore,(BYTE *)((long)src + (srcSize - sStack_88)),sStack_88);
    local_48 = ZSTD_compressSequences
                         (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                          &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,dst,dstCapacity
                          ,srcSize,zc->entropyWorkspace,0x1800,zc->bmi2);
  }
  uVar13 = ERR_isError(local_48);
  if ((uVar13 == 0) && (local_48 != 0)) {
    pZVar2 = (zc->blockState).prevCBlock;
    (zc->blockState).prevCBlock = (zc->blockState).nextCBlock;
    (zc->blockState).nextCBlock = pZVar2;
  }
  if ((((zc->blockState).prevCBlock)->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
    (((zc->blockState).prevCBlock)->entropy).fse.offcode_repeatMode = FSE_repeat_check;
  }
  return local_48;
}

Assistant:

static size_t ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    size_t cSize;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)ms->window.dictLimit, (unsigned)ms->nextToUpdate);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);

    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);

    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        cSize = 0;
        goto out;  /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;   /* required for optimal parser to read stats from dictionary */

    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            CHECK_F(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, dictMode);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }

    /* encode sequences and literals */
    cSize = ZSTD_compressSequences(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, HUF_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

out:
    if (!ZSTD_isError(cSize) && cSize != 0) {
        /* confirm repcodes and entropy tables when emitting a compressed block */
        ZSTD_compressedBlockState_t* const tmp = zc->blockState.prevCBlock;
        zc->blockState.prevCBlock = zc->blockState.nextCBlock;
        zc->blockState.nextCBlock = tmp;
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}